

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DepsBuildEngineTest.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_83776::SimpleRule::SimpleRule
          (SimpleRule *this,KeyType *key,
          vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *inputs,
          ComputeFnType *compute,ValidFnType *valid)

{
  CommandSignature local_28;
  
  local_28.value = 0;
  llbuild::core::Rule::Rule(&this->super_Rule,key,&local_28);
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__SimpleRule_001f3308;
  std::function<int_(const_std::vector<int,_std::allocator<int>_>_&)>::function
            (&this->compute,compute);
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::vector
            (&this->inputs,inputs);
  std::function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>::function
            (&this->valid,valid);
  return;
}

Assistant:

SimpleRule(const KeyType& key, const std::vector<KeyType>& inputs,
               SimpleTask::ComputeFnType compute, ValidFnType valid = nullptr)
        : Rule(key), compute(compute), inputs(inputs), valid(valid) { }